

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O0

float __thiscall Rml::Box::GetCumulativeEdge(Box *this,BoxArea area,BoxEdge edge)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int local_24;
  int i;
  int max_area;
  float size;
  BoxEdge edge_local;
  BoxArea area_local;
  Box *this_local;
  
  if ((area == Auto) &&
     (bVar2 = Assert("RMLUI_ASSERT(area != BoxArea::Auto)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                     ,0x59), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  i = 0;
  iVar3 = Math::Min<int>(area,2);
  for (local_24 = 0; local_24 <= iVar3; local_24 = local_24 + 1) {
    i = (int)(this->area_edges[local_24][(int)edge] + (float)i);
  }
  return (float)i;
}

Assistant:

float Box::GetCumulativeEdge(BoxArea area, BoxEdge edge) const
{
	RMLUI_ASSERT(area != BoxArea::Auto);
	float size = 0;
	int max_area = Math::Min((int)area, (int)BoxArea::Padding);
	for (int i = 0; i <= max_area; i++)
		size += area_edges[i][(int)edge];

	return size;
}